

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

logic_t __thiscall slang::SVInt::operator[](SVInt *this,int32_t index)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  SVInt *pSVar4;
  SVInt *pSVar5;
  bitwidth_t bi;
  ulong uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  
  uVar8 = 0x80;
  if ((-1 < index) && (uVar2 = (this->super_SVIntStorage).bitWidth, (uint)index < uVar2)) {
    uVar6 = 1L << ((byte)index & 0x3f);
    pSVar4 = (SVInt *)((ulong)((uint)index >> 3 & 0xfffffff8) +
                      (long)(this->super_SVIntStorage).field_0.pVal);
    bVar1 = (this->super_SVIntStorage).unknownFlag;
    pSVar5 = this;
    if ((bVar1 & 1U) != 0) {
      pSVar5 = pSVar4;
    }
    if (0x40 < uVar2) {
      pSVar5 = pSVar4;
    }
    uVar3 = (pSVar5->super_SVIntStorage).field_0.val;
    uVar8 = (uVar3 >> ((ulong)(uint)index & 0x3f) & 1) != 0;
    if ((bVar1 & 1U) != 0) {
      uVar7 = 0x80;
      if ((uVar3 & uVar6) != 0) {
        uVar7 = '@';
      }
      if (((this->super_SVIntStorage).field_0.pVal[(uVar2 + 0x3f >> 6) + ((uint)index >> 6)] & uVar6
          ) != 0) {
        uVar8 = uVar7;
      }
    }
  }
  return (logic_t)uVar8;
}

Assistant:

logic_t SVInt::operator[](int32_t index) const {
    bitwidth_t bi = bitwidth_t(index);
    if (index < 0 || bi >= bitWidth)
        return logic_t::x;

    bool bit = (maskBit(bi) & (isSingleWord() ? val : pVal[whichWord(bi)])) != 0;
    if (!unknownFlag)
        return logic_t(bit);

    bool unknownBit = (maskBit(bi) & pVal[whichWord(bi) + getNumWords(bitWidth, false)]) != 0;
    if (!unknownBit)
        return logic_t(bit);

    return bit ? logic_t::z : logic_t::x;
}